

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<float>::MergeFrom
          (RepeatedField<float> *this,RepeatedField<float> *other)

{
  int index;
  LogMessage *pLVar1;
  float *__dest;
  float *__src;
  LogMessage local_a0;
  LogMessage local_68;
  LogFinisher local_29;
  
  if (other == this) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
               ,0x57b);
    pLVar1 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (&other) != (this): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar1);
    internal::LogMessage::~LogMessage(&local_a0);
  }
  if (other->current_size_ != 0) {
    index = this->current_size_;
    Reserve(this,other->current_size_ + index);
    AddNAlreadyReserved(this,other->current_size_);
    __dest = Mutable(this,index);
    if (other->current_size_ < 1) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
                 ,0x511);
      pLVar1 = internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (index) < (current_size_): ");
      internal::LogFinisher::operator=(&local_29,pLVar1);
      internal::LogMessage::~LogMessage(&local_68);
    }
    __src = elements(other);
    memcpy(__dest,__src,(long)other->current_size_ << 2);
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::MergeFrom(const RepeatedField& other) {
  GOOGLE_DCHECK_NE(&other, this);
  if (other.current_size_ != 0) {
    int existing_size = size();
    Reserve(existing_size + other.size());
    AddNAlreadyReserved(other.size());
    CopyArray(Mutable(existing_size), &other.Get(0), other.size());
  }
}